

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O2

node_map * __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::expand
          (node_map *__return_storage_ptr__,plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this
          )

{
  node_map *pnVar1;
  uint64_t uVar2;
  ulong i_00;
  uint64_t i;
  ulong i_01;
  ulong node_id;
  pointer ppVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  path;
  uint64_t new_node_id;
  unsigned_long local_c0;
  node_map *local_b8;
  bit_vector done_flags;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> new_ht;
  
  plain_bonsai_trie(&new_ht,(this->capa_size_).bits_ + 1,(this->symb_size_).bits_);
  new_ht.size_ = 1;
  bit_vector::bit_vector(&done_flags,(this->capa_size_).mask_ + 1);
  *done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start =
       *done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start | 2;
  compact_vector::set(&this->table_,1,1);
  path.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  path.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  path.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = __return_storage_ptr__;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve(&path,0x100);
  for (i_01 = 2; pnVar1 = local_b8, i_01 < (this->table_).size_; i_01 = i_01 + 1) {
    if (((done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[i_01 >> 6] >> (i_01 & 0x3f) & 1) == 0) &&
       (uVar2 = compact_vector::get(&this->table_,i_01), uVar2 != 0)) {
      node_id = i_01;
      if (path.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          path.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        path.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             path.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      do {
        pVar4 = get_parent_and_symb(this,node_id);
        local_c0 = pVar4.second;
        i_00 = pVar4.first;
        new_node_id = node_id;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&path,(pair<unsigned_long,_unsigned_long> *)&new_node_id);
        node_id = i_00;
      } while ((done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start[i_00 >> 6] >> (i_00 & 0x3f) & 1) == 0);
      new_node_id = compact_vector::get(&this->table_,i_00);
      for (ppVar3 = path.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppVar3 != path.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar3 = ppVar3 + -1) {
        add_child(&new_ht,&new_node_id,ppVar3[-1].second);
        compact_vector::set(&this->table_,ppVar3[-1].first,new_node_id);
        done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start[ppVar3[-1].first >> 6] =
             done_flags.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[ppVar3[-1].first >> 6] |
             1L << (ppVar3[-1].first & 0x3f);
      }
    }
  }
  node_map::node_map(local_b8,&this->table_,&done_flags);
  std::swap<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>>(this,&new_ht);
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&path.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&done_flags);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&new_ht);
  return pnVar1;
}

Assistant:

node_map expand() {
        plain_bonsai_trie new_ht{capa_bits() + 1, symb_size_.bits()};
        new_ht.add_root();

#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        bit_vector done_flags(capa_size());
        done_flags.set(get_root());

        table_.set(get_root(), new_ht.get_root());

        std::vector<std::pair<uint64_t, uint64_t>> path;
        path.reserve(256);

        // 0 is empty, 1 is root
        for (uint64_t i = 2; i < table_.size(); ++i) {
            if (done_flags[i] || table_[i] == 0) {
                // skip already processed or empty elements
                continue;
            }

            path.clear();
            uint64_t node_id = i;

            do {
                auto [parent, label] = get_parent_and_symb(node_id);
                assert(parent != nil_id);
                path.emplace_back(std::make_pair(node_id, label));
                node_id = parent;
            } while (!done_flags[node_id]);

            uint64_t new_node_id = table_[node_id];

            for (auto rit = std::rbegin(path); rit != std::rend(path); ++rit) {
                new_ht.add_child(new_node_id, rit->second);
                table_.set(rit->first, new_node_id);
                done_flags.set(rit->first);
            }
        }

        node_map node_map{std::move(table_), std::move(done_flags)};
        std::swap(*this, new_ht);

        return node_map;
    }